

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2builder.cc
# Opt level: O2

void __thiscall
S2Builder::SnapEdge(S2Builder *this,InputEdgeId e,vector<int,_std::allocator<int>_> *chain)

{
  S1ChordAngle *pSVar1;
  pointer pcVar2;
  uint uVar3;
  pointer pVVar4;
  pointer pcVar5;
  int *piVar6;
  int iVar7;
  Excluded EVar8;
  int iVar9;
  pointer piVar10;
  ostream *poVar11;
  S2Point *pSVar12;
  S2Point *x;
  s2pred *this_00;
  anon_union_8_2_a5b77b59_for_compact_array_base<int,_std::allocator<int>_>_13 *paVar13;
  ulong uVar14;
  pointer __x;
  int *piVar15;
  SiteId site_id;
  S2Builder *local_a8;
  vector<int,_std::allocator<int>_> *local_a0;
  anon_union_8_2_a5b77b59_for_compact_array_base<int,_std::allocator<int>_>_13 *local_98;
  anon_union_8_2_a5b77b59_for_compact_array_base<int,_std::allocator<int>_>_13 *local_90;
  S2Point b;
  S1ChordAngle ac;
  S1ChordAngle bc;
  S2Point a;
  
  piVar10 = (chain->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
            _M_start;
  if ((chain->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
      _M_finish != piVar10) {
    (chain->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data._M_finish
         = piVar10;
  }
  __x = (this->input_edges_).
        super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>._M_impl.
        super__Vector_impl_data._M_start + e;
  if (this->snapping_needed_ == false) {
    std::vector<int,_std::allocator<int>_>::push_back(chain,&__x->first);
    std::vector<int,_std::allocator<int>_>::push_back(chain,&__x->second);
    return;
  }
  pVVar4 = (this->input_vertices_).
           super__Vector_base<Vector3<double>,_std::allocator<Vector3<double>_>_>._M_impl.
           super__Vector_impl_data._M_start;
  pcVar5 = (this->edge_sites_).
           super__Vector_base<gtl::compact_array<int,_std::allocator<int>_>,_std::allocator<gtl::compact_array<int,_std::allocator<int>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  local_90 = &pcVar5[e].super_compact_array_base<int,_std::allocator<int>_>.field_7;
  paVar13 = local_90;
  if (pcVar5[e].super_compact_array_base<int,_std::allocator<int>_>.is_inlined_ == false) {
    paVar13 = (anon_union_8_2_a5b77b59_for_compact_array_base<int,_std::allocator<int>_>_13 *)
              pcVar5[e].super_compact_array_base<int,_std::allocator<int>_>.field_7.pointer_;
  }
  pSVar12 = pVVar4 + __x->first;
  this_00 = (s2pred *)(pVVar4 + __x->second);
  pcVar2 = pcVar5 + e;
  piVar15 = (int *)((long)paVar13 +
                   (ulong)(*(uint *)&pcVar5[e].super_compact_array_base<int,_std::allocator<int>_> &
                          0xffffff) * 4);
  local_a8 = this;
  local_a0 = chain;
  do {
    if (paVar13 ==
        (anon_union_8_2_a5b77b59_for_compact_array_base<int,_std::allocator<int>_>_13 *)piVar15) {
      if ((chain->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
          _M_start !=
          (chain->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
          _M_finish) {
        if ((pcVar2->super_compact_array_base<int,_std::allocator<int>_>).is_inlined_ == false) {
          local_90 = (anon_union_8_2_a5b77b59_for_compact_array_base<int,_std::allocator<int>_>_13 *
                     )(pcVar2->super_compact_array_base<int,_std::allocator<int>_>).field_7.pointer_
          ;
        }
        uVar3 = *(uint *)&pcVar2->super_compact_array_base<int,_std::allocator<int>_>;
        for (uVar14 = 0; (uVar3 & 0xffffff) << 2 != uVar14; uVar14 = uVar14 + 4) {
          pSVar12 = (S2Point *)
                    (long)(chain->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                          super__Vector_impl_data._M_finish[-1];
          pVVar4 = (this->sites_).
                   super__Vector_base<Vector3<double>,_std::allocator<Vector3<double>_>_>._M_impl.
                   super__Vector_impl_data._M_start;
          iVar7 = s2pred::CompareDistances
                            (this_00,pVVar4 + (long)pSVar12,
                             pVVar4 + *(int *)((long)local_90 + uVar14),pSVar12);
          if (0 < iVar7) {
            S2LogMessage::S2LogMessage
                      ((S2LogMessage *)&b,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/figroc[P]s2geometry/src/s2/s2builder.cc"
                       ,0x40e,kError,(ostream *)&std::cerr);
            std::operator<<((ostream *)b.c_[1],"Snapping invariant broken!");
            S2LogMessage::~S2LogMessage((S2LogMessage *)&b);
          }
        }
        if (s2builder_verbose != false) {
          poVar11 = std::operator<<((ostream *)&std::cout,"(");
          poVar11 = (ostream *)std::ostream::operator<<(poVar11,__x->first);
          poVar11 = std::operator<<(poVar11,",");
          poVar11 = (ostream *)std::ostream::operator<<(poVar11,__x->second);
          std::operator<<(poVar11,"): ");
          piVar6 = (chain->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                   super__Vector_impl_data._M_finish;
          for (piVar15 = (chain->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                         super__Vector_impl_data._M_start; piVar15 != piVar6; piVar15 = piVar15 + 1)
          {
            poVar11 = (ostream *)std::ostream::operator<<(&std::cout,*piVar15);
            std::operator<<(poVar11," ");
          }
          std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
        }
        return;
      }
      S2LogMessage::S2LogMessage
                ((S2LogMessage *)&b,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/figroc[P]s2geometry/src/s2/s2builder.cc"
                 ,0x409,kFatal,(ostream *)&std::cerr);
      std::operator<<((ostream *)b.c_[1],"Check failed: !chain->empty() ");
LAB_001f2592:
      abort();
    }
    site_id = *(SiteId *)paVar13;
    x = (this->sites_).super__Vector_base<Vector3<double>,_std::allocator<Vector3<double>_>_>.
        _M_impl.super__Vector_impl_data._M_start + site_id;
    iVar7 = s2pred::CompareEdgeDistance
                      (x,pSVar12,(S2Point *)this_00,
                       (S1ChordAngle)(this->edge_snap_radius_ca_).length2_);
    if (iVar7 < 1) {
      piVar10 = (chain->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                super__Vector_impl_data._M_finish;
      local_98 = paVar13;
      while ((chain->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
             _M_start != piVar10) {
        pVVar4 = (this->sites_).
                 super__Vector_base<Vector3<double>,_std::allocator<Vector3<double>_>_>._M_impl.
                 super__Vector_impl_data._M_start;
        b.c_[2] = pVVar4[piVar10[-1]].c_[2];
        pVVar4 = pVVar4 + piVar10[-1];
        b.c_[0] = pVVar4->c_[0];
        b.c_[1] = pVVar4->c_[1];
        S1ChordAngle::S1ChordAngle(&bc,&b,x);
        if ((this->max_adjacent_site_separation_ca_).length2_ <= bc.length2_) break;
        EVar8 = s2pred::GetVoronoiSiteExclusion
                          (&b,x,pSVar12,(S2Point *)this_00,
                           (S1ChordAngle)(this->edge_snap_radius_ca_).length2_);
        if (EVar8 != FIRST) {
          paVar13 = local_98;
          if (EVar8 == SECOND) goto LAB_001f23d4;
          if (EVar8 != NEITHER) {
            S2LogMessage::S2LogMessage
                      ((S2LogMessage *)&a,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/figroc[P]s2geometry/src/s2/s2builder.cc"
                       ,0x3ee,kFatal,(ostream *)&std::cerr);
            std::operator<<((ostream *)a.c_[1],
                            "Check failed: (s2pred::Excluded::NEITHER) == (result) ");
            goto LAB_001f2592;
          }
          piVar10 = (chain->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                    super__Vector_impl_data._M_finish;
          if ((ulong)((long)piVar10 -
                     (long)(chain->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                           super__Vector_impl_data._M_start) < 5) break;
          iVar7 = piVar10[-2];
          pVVar4 = (this->sites_).
                   super__Vector_base<Vector3<double>,_std::allocator<Vector3<double>_>_>._M_impl.
                   super__Vector_impl_data._M_start;
          a.c_[2] = pVVar4[iVar7].c_[2];
          pVVar4 = pVVar4 + iVar7;
          a.c_[0] = pVVar4->c_[0];
          a.c_[1] = pVVar4->c_[1];
          S1ChordAngle::S1ChordAngle(&ac,&a,x);
          pSVar1 = &this->max_adjacent_site_separation_ca_;
          chain = local_a0;
          this = local_a8;
          if (pSVar1->length2_ <= ac.length2_) break;
          iVar7 = s2pred::Sign(pSVar12,(S2Point *)this_00,&b);
          iVar9 = s2pred::Sign(&a,&b,x);
          chain = local_a0;
          this = local_a8;
          if ((iVar9 == iVar7) ||
             (iVar9 = s2pred::EdgeCircumcenterSign(pSVar12,(S2Point *)this_00,&a,&b,x),
             chain = local_a0, this = local_a8, iVar9 != iVar7)) break;
        }
        piVar10 = (chain->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                  super__Vector_impl_data._M_finish + -1;
        (chain->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
        _M_finish = piVar10;
      }
      std::vector<int,_std::allocator<int>_>::push_back(chain,&site_id);
      paVar13 = local_98;
    }
LAB_001f23d4:
    paVar13 = (anon_union_8_2_a5b77b59_for_compact_array_base<int,_std::allocator<int>_>_13 *)
              ((long)paVar13 + 4);
  } while( true );
}

Assistant:

void S2Builder::SnapEdge(InputEdgeId e, vector<SiteId>* chain) const {
  chain->clear();
  const InputEdge& edge = input_edges_[e];
  if (!snapping_needed_) {
    chain->push_back(edge.first);
    chain->push_back(edge.second);
    return;
  }

  const S2Point& x = input_vertices_[edge.first];
  const S2Point& y = input_vertices_[edge.second];

  // Optimization: if there is only one nearby site, return.
  // Optimization: if there are exactly two nearby sites, and one is close
  // enough to each vertex, then return.

  // Now iterate through the sites.  We keep track of the sequence of sites
  // that are visited.
  const auto& candidates = edge_sites_[e];
  for (SiteId site_id : candidates) {
    const S2Point& c = sites_[site_id];
    // Skip any sites that are too far away.  (There will be some of these,
    // because we also keep track of "sites to avoid".)  Note that some sites
    // may be close enough to the line containing the edge, but not to the
    // edge itself, so we can just use the dot product with the edge normal.
    if (s2pred::CompareEdgeDistance(c, x, y, edge_snap_radius_ca_) > 0) {
      continue;
    }
    // Check whether the new site C excludes the previous site B.  If so,
    // repeat with the previous site, and so on.
    bool add_site_c = true;
    for (; !chain->empty(); chain->pop_back()) {
      S2Point b = sites_[chain->back()];

      // First, check whether B and C are so far apart that their clipped
      // Voronoi regions can't intersect.
      S1ChordAngle bc(b, c);
      if (bc >= max_adjacent_site_separation_ca_) break;

      // Otherwise, we want to check whether site C prevents the Voronoi
      // region of B from intersecting XY, or vice versa.  This can be
      // determined by computing the "coverage interval" (the segment of XY
      // intersected by the coverage disc of radius snap_radius) for each
      // site.  If the coverage interval of one site contains the coverage
      // interval of the other, then the contained site can be excluded.
      s2pred::Excluded result = s2pred::GetVoronoiSiteExclusion(
          b, c, x, y, edge_snap_radius_ca_);
      if (result == s2pred::Excluded::FIRST) continue;  // Site B excluded by C
      if (result == s2pred::Excluded::SECOND) {
        add_site_c = false;  // Site C is excluded by B.
        break;
      }
      S2_DCHECK_EQ(s2pred::Excluded::NEITHER, result);

      // Otherwise check whether the previous site A is close enough to B and
      // C that it might further clip the Voronoi region of B.
      if (chain->size() < 2) break;
      S2Point a = sites_[chain->end()[-2]];
      S1ChordAngle ac(a, c);
      if (ac >= max_adjacent_site_separation_ca_) break;

      // If triangles ABC and XYB have the same orientation, the circumcenter
      // Z of ABC is guaranteed to be on the same side of XY as B.
      int xyb = s2pred::Sign(x, y, b);
      if (s2pred::Sign(a, b, c) == xyb) {
        break;  // The circumcenter is on the same side as B but further away.
      }
      // Other possible optimizations:
      //  - if AB > max_adjacent_site_separation_ca_ then keep B.
      //  - if d(B, XY) < 0.5 * min(AB, BC) then keep B.

      // If the circumcenter of ABC is on the same side of XY as B, then B is
      // excluded by A and C combined.  Otherwise B is needed and we can exit.
      if (s2pred::EdgeCircumcenterSign(x, y, a, b, c) != xyb) break;
    }
    if (add_site_c) {
      chain->push_back(site_id);
    }
  }
  S2_DCHECK(!chain->empty());
  if (google::DEBUG_MODE) {
    for (SiteId site_id : candidates) {
      if (s2pred::CompareDistances(y, sites_[chain->back()],
                                   sites_[site_id]) > 0) {
        S2_LOG(ERROR) << "Snapping invariant broken!";
      }
    }
  }
  if (s2builder_verbose) {
    std::cout << "(" << edge.first << "," << edge.second << "): ";
    for (SiteId id : *chain) std::cout << id << " ";
    std::cout << std::endl;
  }
}